

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * flatbuffers::cpp::CppGenerator::NativeName
                   (string *__return_storage_ptr__,string *name,StructDef *sd,IDLOptions *opts)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if ((sd == (StructDef *)0x0) || (sd->fixed != false)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::operator+(&bStack_38,&opts->object_prefix,name);
    std::operator+(__return_storage_ptr__,&bStack_38,&opts->object_suffix);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string NativeName(const std::string &name, const StructDef *sd,
                                const IDLOptions &opts) {
    return sd && !sd->fixed ? opts.object_prefix + name + opts.object_suffix
                            : name;
  }